

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O2

double __thiscall
MeshDenoisingBase::getMeanSquareAngleError
          (MeshDenoisingBase *this,TriMesh *DenoisedMesh,TriMesh *OriginalMesh)

{
  double dVar1;
  Normal *pNVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  FaceIter FVar7;
  undefined1 local_68 [8];
  FaceIter f_it2;
  FaceIter f_it1;
  double local_30;
  
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             DenoisedMesh);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)DenoisedMesh);
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             OriginalMesh);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)OriginalMesh);
  join_0x00000010_0x00000000_ =
       OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)DenoisedMesh);
  _local_68 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)OriginalMesh);
  local_30 = 0.0;
  while( true ) {
    FVar7 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)DenoisedMesh);
    if ((BaseHandle)f_it1.mesh_._0_4_ == FVar7.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
        (mesh_ptr)f_it2._8_8_ == FVar7.mesh_) break;
    pNVar2 = OpenMesh::
             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
             normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     *)DenoisedMesh,(FaceHandle)f_it1.mesh_._0_4_);
    dVar5 = (pNVar2->super_VectorDataT<double,_3>).values_[0];
    dVar4 = (pNVar2->super_VectorDataT<double,_3>).values_[1];
    dVar1 = (pNVar2->super_VectorDataT<double,_3>).values_[2];
    pNVar2 = OpenMesh::
             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
             normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     *)OriginalMesh,f_it2.mesh_._0_4_);
    dVar4 = dVar1 * (pNVar2->super_VectorDataT<double,_3>).values_[2] +
            dVar4 * (pNVar2->super_VectorDataT<double,_3>).values_[1] +
            dVar5 * (pNVar2->super_VectorDataT<double,_3>).values_[0] + 0.0;
    dVar5 = -1.0;
    if (-1.0 <= dVar4) {
      dVar5 = dVar4;
    }
    if (1.0 <= dVar5) {
      dVar5 = 1.0;
    }
    dVar5 = acos(dVar5);
    local_30 = local_30 + (dVar5 * 180.0) / 3.141592653589793;
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)&f_it2.hnd_,0);
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_68,0);
  }
  uVar3 = (**(code **)(*(long *)&(DenoisedMesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))(DenoisedMesh);
  auVar6._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar6._0_8_ = uVar3;
  auVar6._12_4_ = 0x45300000;
  return local_30 /
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
}

Assistant:

double MeshDenoisingBase::getMeanSquareAngleError(TriMesh &DenoisedMesh, TriMesh &OriginalMesh)
{
    DenoisedMesh.request_face_normals();
    DenoisedMesh.update_face_normals();

    OriginalMesh.request_face_normals();
    OriginalMesh.update_face_normals();

    double mean_square_angle_error = 0.0;
    for (TriMesh::FaceIter f_it1 = DenoisedMesh.faces_begin(), f_it2 = OriginalMesh.faces_begin();
        f_it1 != DenoisedMesh.faces_end(); f_it1++, f_it2++ )
    {
        TriMesh::Normal normal1 = DenoisedMesh.normal(*f_it1);
        TriMesh::Normal normal2 = OriginalMesh.normal(*f_it2);
        double cross_value = normal1 | normal2;
        cross_value = std::min(1.0, std::max(cross_value, -1.0));
        mean_square_angle_error += std::acos(cross_value) * 180.0 / M_PI;
    }

    return mean_square_angle_error / (double)DenoisedMesh.n_faces();
}